

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

TimeZone * __thiscall
icu_63::TimeZoneFormat::createTimeZoneForOffset(TimeZoneFormat *this,int32_t offset)

{
  TimeZone *pTVar1;
  ConstChar16Ptr local_60 [3];
  UnicodeString local_48;
  
  if (offset != 0) {
    pTVar1 = ZoneMeta::createCustomTimeZone(offset);
    return pTVar1;
  }
  local_60[0].p_ = (char16_t *)TZID_GMT;
  UnicodeString::UnicodeString(&local_48,'\x01',local_60,-1);
  pTVar1 = TimeZone::createTimeZone(&local_48);
  UnicodeString::~UnicodeString(&local_48);
  return pTVar1;
}

Assistant:

TimeZone*
TimeZoneFormat::createTimeZoneForOffset(int32_t offset) const {
    if (offset == 0) {
        // when offset is 0, we should use "Etc/GMT"
        return TimeZone::createTimeZone(UnicodeString(TRUE, TZID_GMT, -1));
    }
    return ZoneMeta::createCustomTimeZone(offset);
}